

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRep * __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::SubTree(CordRepBtree *this,size_t offset,size_t n)

{
  CordRep *pCVar1;
  CordRepBtree *pCVar2;
  int *piVar3;
  iterator ppCVar4;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *end_00;
  Position PVar5;
  CopyResult CVar6;
  CordRep *r;
  iterator __end2;
  iterator __begin2;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *local_108;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *__range2;
  size_t end;
  CordRepBtree *sub;
  undefined4 local_e8;
  undefined4 uStack_e4;
  CordRep *local_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  int local_d0;
  int local_cc;
  int h_1;
  int h;
  int local_c0;
  undefined4 uStack_bc;
  CordRep *local_b8;
  int local_b0;
  undefined4 uStack_ac;
  CordRepBtree *local_a8;
  CopyResult suffix;
  CopyResult prefix;
  CordRep *right;
  CordRep *local_70;
  Position back;
  CordRep *local_50;
  CordRep *left;
  Position front;
  CordRepBtree *pCStack_30;
  int height;
  CordRepBtree *node;
  size_t n_local;
  size_t offset_local;
  CordRepBtree *this_local;
  
  if ((this->super_CordRep).length < n) {
    __assert_fail("n <= this->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x38a,"CordRep *absl::cord_internal::CordRepBtree::SubTree(size_t, size_t)");
  }
  if ((this->super_CordRep).length - n < offset) {
    __assert_fail("offset <= this->length - n",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x38b,"CordRep *absl::cord_internal::CordRepBtree::SubTree(size_t, size_t)");
  }
  if (n == 0) {
    this_local = (CordRepBtree *)0x0;
  }
  else {
    front.n._4_4_ = CordRepBtree::height(this);
    _left = IndexOf(this,offset);
    local_50 = this->edges_[(long)left];
    pCStack_30 = this;
    while (front.index + n <= local_50->length) {
      front.n._4_4_ = front.n._4_4_ + -1;
      if (front.n._4_4_ < 0) {
        pCVar1 = CordRep::Ref(local_50);
        pCVar1 = anon_unknown_0::MakeSubstring(pCVar1,front.index,n);
        return pCVar1;
      }
      pCStack_30 = CordRep::btree(local_50);
      _left = IndexOf(pCStack_30,front.index);
      back.n = left;
      local_50 = pCStack_30->edges_[back.n];
    }
    PVar5 = IndexBefore(pCStack_30,_left,n);
    local_70 = (CordRep *)PVar5.index;
    prefix._8_8_ = pCStack_30->edges_[(long)local_70];
    if (local_70 <= left) {
      __assert_fail("back.index > front.index",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                    ,0x39b,"CordRep *absl::cord_internal::CordRepBtree::SubTree(size_t, size_t)");
    }
    back.index = PVar5.n;
    if (front.n._4_4_ < 1) {
      pCVar1 = CordRep::Ref(local_50);
      local_e0 = anon_unknown_0::MakeSubstring(pCVar1,front.index);
      local_d8 = 0xffffffff;
      prefix.edge = (CordRep *)CONCAT44(uStack_d4,0xffffffff);
      suffix._8_8_ = local_e0;
      pCVar1 = CordRep::Ref((CordRep *)prefix._8_8_);
      sub = (CordRepBtree *)anon_unknown_0::MakeSubstring(pCVar1,0,back.index);
      local_e8 = 0xffffffff;
      suffix.edge = (CordRep *)CONCAT44(uStack_e4,0xffffffff);
      local_a8 = sub;
    }
    else {
      pCVar2 = CordRep::btree(local_50);
      CVar6 = CopySuffix(pCVar2,front.index);
      local_b8 = CVar6.edge;
      local_b0 = CVar6.height;
      prefix.edge = (CordRep *)CONCAT44(uStack_ac,local_b0);
      suffix._8_8_ = local_b8;
      pCVar2 = CordRep::btree((CordRep *)prefix._8_8_);
      CVar6 = CopyPrefix(pCVar2,back.index,true);
      _h_1 = (CordRepBtree *)CVar6.edge;
      local_c0 = CVar6.height;
      suffix.edge = (CordRep *)CONCAT44(uStack_bc,local_c0);
      local_a8 = _h_1;
      if ((CordRep *)((long)&left->length + 1U) == local_70) {
        piVar3 = std::max<int>((int *)&prefix,(int *)&suffix);
        front.n._4_4_ = *piVar3 + 1;
      }
      local_cc = (int)prefix.edge;
      while (local_cc = local_cc + 1, local_cc < front.n._4_4_) {
        suffix._8_8_ = New((CordRep *)suffix._8_8_);
      }
      local_d0 = (int)suffix.edge;
      while (local_d0 = local_d0 + 1, local_d0 < front.n._4_4_) {
        local_a8 = New(&local_a8->super_CordRep);
      }
    }
    end = (size_t)New(front.n._4_4_);
    __range2 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)0x1;
    ((CordRepBtree *)end)->edges_[0] = (CordRep *)suffix._8_8_;
    ___begin2 = Edges(pCStack_30,(size_t)((long)&left->length + 1),(size_t)local_70);
    local_108 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)&__begin2;
    __end2 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::begin(local_108);
    ppCVar4 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::end(local_108);
    for (; __end2 != ppCVar4; __end2 = __end2 + 1) {
      pCVar1 = CordRep::Ref(*__end2);
      *(CordRep **)(end + 0x10 + (long)__range2 * 8) = pCVar1;
      __range2 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)
                 ((long)&__range2->ptr_ + 1);
    }
    end_00 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)((long)&__range2->ptr_ + 1);
    *(CordRepBtree **)(end + 0x10 + (long)__range2 * 8) = local_a8;
    __range2 = end_00;
    set_end((CordRepBtree *)end,(size_t)end_00);
    *(size_t *)end = n;
    this_local = AssertValid((CordRepBtree *)end,true);
  }
  return &this_local->super_CordRep;
}

Assistant:

CordRep* CordRepBtree::SubTree(size_t offset, size_t n) {
  assert(n <= this->length);
  assert(offset <= this->length - n);
  if (ABSL_PREDICT_FALSE(n == 0)) return nullptr;

  CordRepBtree* node = this;
  int height = node->height();
  Position front = node->IndexOf(offset);
  CordRep* left = node->edges_[front.index];
  while (front.n + n <= left->length) {
    if (--height < 0) return MakeSubstring(CordRep::Ref(left), front.n, n);
    node = left->btree();
    front = node->IndexOf(front.n);
    left = node->edges_[front.index];
  }

  const Position back = node->IndexBefore(front, n);
  CordRep* const right = node->edges_[back.index];
  assert(back.index > front.index);

  // Get partial suffix and prefix entries.
  CopyResult prefix;
  CopyResult suffix;
  if (height > 0) {
    // Copy prefix and suffix of the boundary nodes.
    prefix = left->btree()->CopySuffix(front.n);
    suffix = right->btree()->CopyPrefix(back.n);

    // If there is an edge between the prefix and suffix edges, then the tree
    // must remain at its previous (full) height. If we have no edges between
    // prefix and suffix edges, then the tree must be as high as either the
    // suffix or prefix edges (which are collapsed to their minimum heights).
    if (front.index + 1 == back.index) {
      height = (std::max)(prefix.height, suffix.height) + 1;
    }

    // Raise prefix and suffixes to the new tree height.
    for (int h = prefix.height + 1; h < height; ++h) {
      prefix.edge = CordRepBtree::New(prefix.edge);
    }
    for (int h = suffix.height + 1; h < height; ++h) {
      suffix.edge = CordRepBtree::New(suffix.edge);
    }
  } else {
    // Leaf node, simply take substrings for prefix and suffix.
    prefix = CopyResult{MakeSubstring(CordRep::Ref(left), front.n), -1};
    suffix = CopyResult{MakeSubstring(CordRep::Ref(right), 0, back.n), -1};
  }

  // Compose resulting tree.
  CordRepBtree* sub = CordRepBtree::New(height);
  size_t end = 0;
  sub->edges_[end++] = prefix.edge;
  for (CordRep* r : node->Edges(front.index + 1, back.index)) {
    sub->edges_[end++] = CordRep::Ref(r);
  }
  sub->edges_[end++] = suffix.edge;
  sub->set_end(end);
  sub->length = n;
  return AssertValid(sub);
}